

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rule.h
# Opt level: O0

void __thiscall
lf::quad::QuadRule::QuadRule
          (QuadRule *this,RefEl ref_el,MatrixXd *points,VectorXd *weights,quadDegree_t degree)

{
  dim_t dVar1;
  ulong uVar2;
  Index IVar3;
  Index IVar4;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  stringstream local_438 [8];
  stringstream ss_1;
  ostream local_428 [383];
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [396];
  quadDegree_t local_2c;
  VectorXd *pVStack_28;
  quadDegree_t degree_local;
  VectorXd *weights_local;
  MatrixXd *points_local;
  QuadRule *this_local;
  RefEl ref_el_local;
  
  (this->ref_el_).type_ = ref_el.type_;
  this->degree_ = degree;
  local_2c = degree;
  pVStack_28 = weights;
  weights_local = (VectorXd *)points;
  points_local = (MatrixXd *)this;
  this_local._7_1_ = ref_el.type_;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->points_,points);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->weights_,weights);
  uVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&(this->points_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  dVar1 = lf::base::RefEl::Dimension(&this->ref_el_);
  if (uVar2 != dVar1) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::operator<<(local_1b8,"Dimension mismatch");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"points_.rows() == ref_el_.Dimension()",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/quad_rule.h"
               ,&local_211);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e8,&local_210,0x70,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"false",&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/quad_rule.h"
               ,&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2a9);
    lf::base::AssertionFailed(&local_258,&local_280,0x70,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    abort();
  }
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->weights_);
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&(this->points_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar3 != IVar4) {
    std::__cxx11::stringstream::stringstream(local_438);
    std::operator<<(local_428,"Dimension mismatch");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"weights_.size() == points_.cols()",&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/quad_rule.h"
               ,&local_481);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_458,&local_480,0x71,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"false",&local_4c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/quad_rule.h"
               ,&local_4f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"",&local_519);
    lf::base::AssertionFailed(&local_4c8,&local_4f0,0x71,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    abort();
  }
  return;
}

Assistant:

explicit QuadRule(base::RefEl ref_el, Eigen::MatrixXd points,
                    Eigen::VectorXd weights, quadDegree_t degree)
      : ref_el_(std::move(ref_el)),
        degree_(degree),
        points_(std::move(points)),
        weights_(std::move(weights)) {
    LF_ASSERT_MSG(points_.rows() == ref_el_.Dimension(), "Dimension mismatch");
    LF_ASSERT_MSG(weights_.size() == points_.cols(), "Dimension mismatch");
  }